

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<char,fmt::v10::appender,float>
                   (appender out,float value,format_specs<char> specs,locale_ref loc)

{
  locale_ref loc_00;
  string_view bytes;
  format_specs<char> specs_00;
  appender out_00;
  bool bVar1;
  type s;
  char cVar2;
  int iVar3;
  int iVar4;
  float_specs fVar5;
  appender *paVar6;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_01;
  size_t count;
  undefined8 in_RDX;
  long in_RSI;
  buffer<char> *in_RDI;
  float in_XMM0_Da;
  big_decimal_fp *f_00;
  big_decimal_fp f;
  int exp;
  int precision;
  memory_buffer buffer;
  appender it;
  float_specs fspecs;
  format_specs<char> *in_stack_fffffffffffffc98;
  buffer<char> *pbVar7;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  format_specs<char> *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  int iVar8;
  float_specs in_stack_fffffffffffffcc0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffcc8;
  float_specs *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  undefined1 isnan;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined8 in_stack_fffffffffffffd10;
  undefined5 uVar9;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  int local_2e0;
  basic_string_view<char> local_2d8;
  buffer<char> *local_2c8;
  ulong local_2c0;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd54;
  double in_stack_fffffffffffffd58;
  float_specs in_stack_fffffffffffffd60;
  buffer<char> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  double in_stack_fffffffffffffea0;
  float_specs in_stack_fffffffffffffeac;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_70;
  char local_61;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_60;
  long local_58;
  undefined8 local_50;
  buffer<char> *local_48;
  undefined8 local_3c;
  float local_34;
  undefined8 local_28;
  undefined8 local_20;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  float local_4;
  
  isnan = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  local_34 = in_XMM0_Da;
  local_28 = in_RSI;
  local_20 = in_RDX;
  local_18.container = in_RDI;
  fVar5 = parse_float_type_spec<char>(in_stack_fffffffffffffc98);
  local_3c._4_4_ = fVar5._4_4_;
  local_3c = CONCAT44(local_3c._4_4_ & 0xffff00ff | (uint)((byte)(local_20._1_2_ >> 4) & 7) << 8,
                      fVar5.precision);
  local_4 = local_34;
  bVar1 = std::signbit((double)local_34);
  if (bVar1) {
    local_3c = local_3c & 0xffff00ffffffffff | 0x10000000000;
    local_34 = -local_34;
  }
  else if ((local_3c._4_4_ >> 8 & 0xff) == 1) {
    local_3c = local_3c & 0xffff00ffffffffff;
  }
  bVar1 = isfinite<float,_0>(0.0);
  if (bVar1) {
    if ((((byte)((ulong)local_20 >> 8) & 0xf) == 4) && ((char)(local_3c >> 0x28) != '\0')) {
      paVar6 = reserve<fmt::v10::appender>((appender *)&local_18,1);
      local_60.container =
           (paVar6->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_61 = sign<char,fmt::v10::sign::type>((type)(local_3c >> 0x28));
      local_70.container = (buffer<char> *)appender::operator++((appender *)&local_60,0);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_70);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                 in_stack_fffffffffffffca0.container,
                 (value_type_conflict1 *)in_stack_fffffffffffffc98);
      local_18.container =
           (buffer<char> *)base_iterator<fmt::v10::appender>(local_18.container,local_60.container);
      local_3c = local_3c & 0xffff00ffffffffff;
      if ((int)local_28 != 0) {
        local_28 = CONCAT44(local_28._4_4_,(int)local_28 + -1);
      }
    }
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               in_stack_fffffffffffffca0.container,(allocator<char> *)in_stack_fffffffffffffc98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd5f);
    cVar2 = (char)(local_3c >> 0x20);
    if (cVar2 == '\x03') {
      s = (type)(local_3c >> 0x28);
      if (s != none) {
        cVar2 = sign<char,fmt::v10::sign::type>(s);
        in_stack_fffffffffffffd48 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffd48);
        buffer<char>::push_back
                  (in_stack_fffffffffffffca0.container,(char *)in_stack_fffffffffffffc98);
      }
      convert_float<float>(local_34);
      local_2c0 = local_3c;
      format_hexfloat<double,_0>
                (in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,in_stack_fffffffffffffd60,
                 (buffer<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_2c8 = local_18.container;
      pbVar7 = (buffer<char> *)&stack0xfffffffffffffd60;
      out_01.container = (buffer<char> *)buffer<char>::data(pbVar7);
      count = buffer<char>::size(pbVar7);
      basic_string_view<char>::basic_string_view(&local_2d8,(char *)out_01.container,count);
      bytes.data_._4_4_ = in_stack_fffffffffffffcbc;
      bytes.data_._0_4_ = in_stack_fffffffffffffcb8;
      bytes.size_ = (size_t)pbVar7;
      local_10.container =
           (buffer<char> *)
           write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                     (out_01.container,bytes,in_stack_fffffffffffffcb0);
    }
    else {
      iVar8 = local_28._4_4_;
      if ((local_28 < 0) && ((char)local_20 != '\0')) {
        iVar8 = 6;
      }
      if (cVar2 == '\x01') {
        in_stack_fffffffffffffcb8 = iVar8;
        iVar4 = iVar8;
        iVar3 = max_value<int>();
        if (in_stack_fffffffffffffcb8 == iVar3) {
          throw_format_error((char *)in_stack_fffffffffffffcb0);
        }
        local_2e0 = iVar8 + 1;
        iVar8 = iVar4;
      }
      else {
        local_2e0 = iVar8;
        if ((cVar2 != '\x02') && (iVar8 == 0)) {
          local_2e0 = 1;
        }
      }
      local_3c = local_3c | 0x4000000000000;
      f_00 = (big_decimal_fp *)convert_float<float>(local_34);
      iVar4 = format_float<double>
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         in_stack_fffffffffffffeac,in_stack_fffffffffffffe90);
      local_3c = CONCAT44(local_3c._4_4_,local_2e0);
      pbVar7 = (buffer<char> *)&stack0xfffffffffffffd60;
      buffer<char>::data(pbVar7);
      buffer<char>::size(pbVar7);
      loc_00.locale_._4_4_ = iVar8;
      loc_00.locale_._0_4_ = in_stack_fffffffffffffcb8;
      in_stack_fffffffffffffca0.container =
           (buffer<char> *)
           write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                     (in_stack_fffffffffffffcc8.container,f_00,
                      (format_specs<char> *)CONCAT44(iVar4,in_stack_fffffffffffffca8),
                      in_stack_fffffffffffffcc0,loc_00);
      local_10.container = in_stack_fffffffffffffca0.container;
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               in_stack_fffffffffffffca0.container);
  }
  else {
    local_48 = local_18.container;
    isnan<float>(local_34);
    local_58 = local_28;
    local_50 = local_20;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffd1c;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffd18;
    specs_00.precision = in_stack_fffffffffffffd0c;
    specs_00.width = in_stack_fffffffffffffd08;
    uVar9 = (undefined5)((ulong)in_stack_fffffffffffffd10 >> 0x18);
    specs_00.type = (char)in_stack_fffffffffffffd10;
    specs_00._9_2_ = (short)((ulong)in_stack_fffffffffffffd10 >> 8);
    specs_00.fill.data_[0] = (char)uVar9;
    specs_00.fill.data_[1] = (char)((uint5)uVar9 >> 8);
    specs_00.fill.data_[2] = (char)((uint5)uVar9 >> 0x10);
    specs_00.fill.data_[3] = (char)((uint5)uVar9 >> 0x18);
    specs_00.fill.size_ = (char)((uint5)uVar9 >> 0x20);
    local_10.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out_00,(bool)isnan,specs_00,in_stack_fffffffffffffcf8);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}